

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O0

RGB __thiscall
pbrt::MIPMap::EWA<pbrt::RGB>(MIPMap *this,int level,Point2f st,Vector2f dst0,Vector2f dst1)

{
  float fVar1;
  undefined1 auVar2 [16];
  Point2i st_00;
  Point2i st_01;
  int iVar3;
  float *pfVar4;
  int *piVar5;
  int in_ESI;
  float fVar6;
  float fVar7;
  double dVar8;
  undefined1 auVar14 [12];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  RGB RVar16;
  Float weight;
  int index;
  Float r2;
  Float ss;
  int is;
  Float tt;
  int it;
  Float sumWts;
  RGB sum;
  int t1;
  int t0;
  int s1;
  int s0;
  Float vSqrt;
  Float uSqrt;
  Float invDet;
  Float det;
  Float invF;
  Float C;
  Float B;
  Float A;
  Point2i levelRes;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  Float in_stack_fffffffffffffe6c;
  RGB *in_stack_fffffffffffffe70;
  RGB *in_stack_fffffffffffffe78;
  MIPMap *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  RGB local_c8;
  float local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  float local_ac;
  float local_a8;
  int local_a4;
  float local_a0;
  int local_9c;
  float local_98;
  RGB local_94;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  Tuple2<pbrt::Point2,_int> local_58 [4];
  int local_34;
  Tuple2<pbrt::Vector2,_float> local_24;
  Tuple2<pbrt::Vector2,_float> local_1c;
  Tuple2<pbrt::Point2,_float> local_14;
  undefined8 local_c;
  Float local_4;
  undefined1 auVar11 [64];
  
  auVar15 = in_ZMM0._8_56_;
  local_14 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  local_1c = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(in_ZMM1._0_16_);
  local_24 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(in_ZMM2._0_16_);
  local_34 = in_ESI;
  iVar3 = Levels((MIPMap *)0x8d82f1);
  if (in_ESI < iVar3) {
    local_58[0] = (Tuple2<pbrt::Point2,_int>)
                  LevelResolution((MIPMap *)
                                  CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                  in_stack_fffffffffffffe64);
    pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_14,0);
    fVar6 = *pfVar4;
    auVar14 = (undefined1  [12])0x0;
    piVar5 = Tuple2<pbrt::Point2,_int>::operator[](local_58,0);
    auVar9._0_4_ = (float)*piVar5;
    auVar9._4_12_ = auVar14;
    auVar9 = vfmadd213ss_fma(auVar9,ZEXT416((uint)fVar6),SUB6416(ZEXT464(0xbf000000),0));
    pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_14,0);
    *pfVar4 = auVar9._0_4_;
    pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_14,1);
    fVar6 = *pfVar4;
    auVar14 = (undefined1  [12])0x0;
    piVar5 = Tuple2<pbrt::Point2,_int>::operator[](local_58,1);
    auVar10._0_4_ = (float)*piVar5;
    auVar10._4_12_ = auVar14;
    auVar9 = vfmadd213ss_fma(auVar10,ZEXT416((uint)fVar6),SUB6416(ZEXT464(0xbf000000),0));
    pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_14,1);
    *pfVar4 = auVar9._0_4_;
    piVar5 = Tuple2<pbrt::Point2,_int>::operator[](local_58,0);
    iVar3 = *piVar5;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,0);
    *pfVar4 = (float)iVar3 * *pfVar4;
    piVar5 = Tuple2<pbrt::Point2,_int>::operator[](local_58,1);
    iVar3 = *piVar5;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,1);
    *pfVar4 = (float)iVar3 * *pfVar4;
    piVar5 = Tuple2<pbrt::Point2,_int>::operator[](local_58,0);
    iVar3 = *piVar5;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_24,0);
    *pfVar4 = (float)iVar3 * *pfVar4;
    piVar5 = Tuple2<pbrt::Point2,_int>::operator[](local_58,1);
    iVar3 = *piVar5;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_24,1);
    *pfVar4 = (float)iVar3 * *pfVar4;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,1);
    fVar6 = *pfVar4;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,1);
    fVar7 = *pfVar4;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_24,1);
    fVar1 = *pfVar4;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_24,1);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar6),
                             ZEXT416((uint)(fVar1 * *pfVar4)));
    local_5c = auVar9._0_4_ + 1.0;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,0);
    fVar6 = *pfVar4;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,1);
    fVar7 = *pfVar4;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_24,0);
    fVar1 = *pfVar4;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_24,1);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar6),
                             ZEXT416((uint)(fVar1 * *pfVar4)));
    local_60 = auVar9._0_4_ * -2.0;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,0);
    fVar6 = *pfVar4;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_1c,0);
    fVar7 = *pfVar4;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_24,0);
    fVar1 = *pfVar4;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](&local_24,0);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar6),
                             ZEXT416((uint)(fVar1 * *pfVar4)));
    local_64 = auVar9._0_4_ + 1.0;
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_64),ZEXT416((uint)local_5c),
                             ZEXT416((uint)-(local_60 * local_60 * 0.25)));
    local_68 = 1.0 / auVar9._0_4_;
    local_5c = local_68 * local_5c;
    local_60 = local_68 * local_60;
    local_64 = local_68 * local_64;
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_60),ZEXT416((uint)-local_60),
                             ZEXT416((uint)(local_5c * 4.0 * local_64)));
    local_6c = auVar9._0_4_;
    local_70 = 1.0 / local_6c;
    local_74 = SafeSqrt(0.0);
    local_78 = SafeSqrt(0.0);
    pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_14,0);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_74),ZEXT416((uint)-(local_70 * 2.0)),
                             ZEXT416((uint)*pfVar4));
    dVar8 = std::ceil(auVar9._0_8_);
    local_7c = (int)SUB84(dVar8,0);
    pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_14,0);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_74),ZEXT416((uint)(local_70 * 2.0)),
                             ZEXT416((uint)*pfVar4));
    dVar8 = std::floor(auVar9._0_8_);
    local_80 = (int)SUB84(dVar8,0);
    pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_14,1);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_78),ZEXT416((uint)-(local_70 * 2.0)),
                             ZEXT416((uint)*pfVar4));
    dVar8 = std::ceil(auVar9._0_8_);
    local_84 = (int)SUB84(dVar8,0);
    pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_14,1);
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_78),ZEXT416((uint)(local_70 * 2.0)),
                             ZEXT416((uint)*pfVar4));
    dVar8 = std::floor(auVar9._0_8_);
    local_88 = (int)SUB84(dVar8,0);
    memset(&local_94,0,0xc);
    RGB::RGB(&local_94);
    local_98 = 0.0;
    for (local_9c = local_84; local_9c <= local_88; local_9c = local_9c + 1) {
      fVar6 = (float)local_9c;
      pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_14,1);
      local_a0 = fVar6 - *pfVar4;
      for (local_a4 = local_7c; local_a4 <= local_80; local_a4 = local_a4 + 1) {
        fVar7 = (float)local_a4;
        pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_14,0);
        local_a8 = fVar7 - *pfVar4;
        auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_a8),ZEXT416((uint)(local_5c * local_a8)),
                                 ZEXT416((uint)(local_60 * local_a8 * local_a0)));
        auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_a0),ZEXT416((uint)(local_64 * local_a0)),auVar9
                                );
        local_ac = auVar9._0_4_;
        if (local_ac < 1.0) {
          local_b4 = (int)(local_ac * 128.0);
          local_b8 = 0x7f;
          piVar5 = std::min<int>(&local_b4,&local_b8);
          local_b0 = *piVar5;
          local_bc = *(float *)(weightLut + (long)local_b0 * 4);
          in_stack_fffffffffffffe70 = (RGB *)0x0;
          Point2<int>::Point2((Point2<int> *)CONCAT44(local_bc,local_34),in_stack_fffffffffffffe5c,
                              in_stack_fffffffffffffe58);
          st_01.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffef0;
          st_01.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffeec;
          RVar16 = Texel<pbrt::RGB>(in_stack_fffffffffffffee0,in_ESI,st_01);
          auVar15 = (undefined1  [56])0x0;
          in_stack_fffffffffffffe6c = RVar16.g;
          auVar2._8_8_ = in_stack_fffffffffffffe70;
          auVar2._0_8_ = RVar16._0_8_;
          vmovlpd_avx(auVar2);
          RVar16 = pbrt::operator*(fVar6,in_stack_fffffffffffffe78);
          local_c8.b = RVar16.b;
          auVar12._0_8_ = RVar16._0_8_;
          auVar12._8_56_ = auVar15;
          local_c8._0_8_ = vmovlpd_avx(auVar12._0_16_);
          RGB::operator+=(&local_94,&local_c8);
          local_98 = local_bc + local_98;
        }
      }
    }
    auVar15 = (undefined1  [56])0x0;
    RVar16 = RGB::operator/(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    local_4 = RVar16.b;
    auVar13._0_8_ = RVar16._0_8_;
    auVar13._8_56_ = auVar15;
    local_c = vmovlpd_avx(auVar13._0_16_);
  }
  else {
    Levels((MIPMap *)0x8d8308);
    Point2<int>::Point2((Point2<int> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                        ,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
    st_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffef0;
    st_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffeec;
    RVar16 = Texel<pbrt::RGB>(in_stack_fffffffffffffee0,in_ESI,st_00);
    local_4 = RVar16.b;
    auVar11._0_8_ = RVar16._0_8_;
    auVar11._8_56_ = auVar15;
    local_c = vmovlpd_avx(auVar11._0_16_);
  }
  RVar16.b = local_4;
  RVar16.r = (Float)(undefined4)local_c;
  RVar16.g = (Float)local_c._4_4_;
  return RVar16;
}

Assistant:

T MIPMap::EWA(int level, Point2f st, Vector2f dst0, Vector2f dst1) const {
    if (level >= Levels())
        return Texel<T>(Levels() - 1, {0, 0});

    // Convert EWA coordinates to appropriate scale for level
    Point2i levelRes = LevelResolution(level);
    st[0] = st[0] * levelRes[0] - 0.5f;
    st[1] = st[1] * levelRes[1] - 0.5f;
    dst0[0] *= levelRes[0];
    dst0[1] *= levelRes[1];
    dst1[0] *= levelRes[0];
    dst1[1] *= levelRes[1];

    // Compute ellipse coefficients to bound EWA filter region
    Float A = dst0[1] * dst0[1] + dst1[1] * dst1[1] + 1;
    Float B = -2 * (dst0[0] * dst0[1] + dst1[0] * dst1[1]);
    Float C = dst0[0] * dst0[0] + dst1[0] * dst1[0] + 1;
    Float invF = 1 / (A * C - B * B * 0.25f);
    A *= invF;
    B *= invF;
    C *= invF;

    // Compute the ellipse's $(s,t)$ bounding box in texture space
    Float det = -B * B + 4 * A * C;
    Float invDet = 1 / det;
    Float uSqrt = SafeSqrt(det * C), vSqrt = SafeSqrt(A * det);
    int s0 = std::ceil(st[0] - 2 * invDet * uSqrt);
    int s1 = std::floor(st[0] + 2 * invDet * uSqrt);
    int t0 = std::ceil(st[1] - 2 * invDet * vSqrt);
    int t1 = std::floor(st[1] + 2 * invDet * vSqrt);

    // Scan over ellipse bound and compute quadratic equation
    T sum{};
    Float sumWts = 0;
    for (int it = t0; it <= t1; ++it) {
        Float tt = it - st[1];
        for (int is = s0; is <= s1; ++is) {
            Float ss = is - st[0];
            // Compute squared radius and filter texel if inside ellipse
            Float r2 = A * ss * ss + B * ss * tt + C * tt * tt;
            if (r2 < 1) {
                int index = std::min<int>(r2 * WeightLUTSize, WeightLUTSize - 1);
                Float weight = weightLut[index];
                sum += weight * Texel<T>(level, {is, it});
                sumWts += weight;
            }
        }
    }
    return sum / sumWts;
}